

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_http_server.c
# Opt level: O2

void test_read_until_errors(void)

{
  uint uVar1;
  int status_code;
  cio_error cVar2;
  cio_inet_address *arg1;
  uint j;
  long lVar3;
  uint i;
  long lVar4;
  _func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_char_ptr_cio_buffered_stream_read_handler_t_void_ptr
  *bs_read_until_fakes [4];
  cio_http_location target;
  cio_http_server_configuration config;
  cio_http_server server;
  
  for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
    uVar1 = test_read_until_errors::tests[lVar4].which_read_until_fails;
    status_code = test_read_until_errors::tests[lVar4].expected_response;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      bs_read_until_fakes[lVar3] = bs_read_until_ok;
    }
    cio_buffered_stream_read_until_fake.custom_fake =
         (_func_cio_error_cio_buffered_stream_ptr_cio_read_buffer_ptr_char_ptr_cio_buffered_stream_read_handler_t_void_ptr
          *)0x0;
    bs_read_until_fakes[uVar1] = bs_read_until_call_fails;
    cio_buffered_stream_read_until_fake.custom_fake_seq_len = 4;
    header_complete_fake.custom_fake = callback_write_ok_response;
    cio_buffered_stream_read_until_fake.custom_fake_seq = bs_read_until_fakes;
    memcpy(&config,&DAT_00118b30,0xb8);
    arg1 = cio_get_inet_address_any4();
    cio_init_inet_socket_address(&config.endpoint,arg1,0x1f90);
    cVar2 = cio_http_server_init(&server,&loop,&config);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Server initialization failed!",0x31a,UNITY_DISPLAY_STYLE_INT);
    cVar2 = cio_http_location_init(&target,"/foo",(void *)0x0,alloc_dummy_handler);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Request target initialization failed!",0x31e,UNITY_DISPLAY_STYLE_INT);
    cVar2 = cio_http_server_register_location(&server,&target);
    UnityAssertEqualNumber
              (0,(long)cVar2,"Register request target failed!",0x321,UNITY_DISPLAY_STYLE_INT);
    split_request("GET /foo HTTP/1.1\r\nfoo: bar\r\n\r\nGET /foo HTTP/1.1\r\nfoo: bar\r\n\r\n");
    cVar2 = cio_http_server_serve(&server);
    UnityAssertEqualNumber(0,(long)cVar2,"Serving http failed!",0x328,UNITY_DISPLAY_STYLE_INT);
    UnityAssertEqualNumber
              (1,(ulong)serve_error_fake.call_count,"Serve error callback was not called!",0x32a,
               UNITY_DISPLAY_STYLE_INT);
    check_http_response(status_code);
    setUp();
  }
  free(&client_socket[-2].impl.close_timer.impl.ev.fd);
  return;
}

Assistant:

static void test_read_until_errors(void)
{
	struct test {
		unsigned int which_read_until_fails;
		int expected_response;
	};

	static const struct test tests[] = {
	    {.which_read_until_fails = 0, .expected_response = 0},
	    {.which_read_until_fails = 1, .expected_response = 500},
	    {.which_read_until_fails = 2, .expected_response = 500},
	    {.which_read_until_fails = 3, .expected_response = 500},
	};

	enum cio_error (*bs_read_until_fakes[ARRAY_SIZE(tests)])(struct cio_buffered_stream *, struct cio_read_buffer *, const char *, cio_buffered_stream_read_handler_t, void *);
	for (unsigned int i = 0; i < ARRAY_SIZE(tests); i++) {
		struct test test = tests[i];

		unsigned int array_size = ARRAY_SIZE(bs_read_until_fakes);
		for (unsigned int j = 0; j < array_size; j++) {
			bs_read_until_fakes[j] = bs_read_until_ok;
		}

		cio_buffered_stream_read_until_fake.custom_fake = NULL;
		bs_read_until_fakes[test.which_read_until_fails] = bs_read_until_call_fails;
		SET_CUSTOM_FAKE_SEQ(cio_buffered_stream_read_until, bs_read_until_fakes, (int)array_size)

		header_complete_fake.custom_fake = callback_write_ok_response;

		struct cio_http_server_configuration config = {
		    .on_error = serve_error,
		    .read_header_timeout_ns = header_read_timeout,
		    .read_body_timeout_ns = body_read_timeout,
		    .response_timeout_ns = response_timeout,
		    .close_timeout_ns = close_timeout_ns,
		    .alloc_client = alloc_dummy_client,
		    .free_client = free_dummy_client};

		cio_init_inet_socket_address(&config.endpoint, cio_get_inet_address_any4(), 8080);

		struct cio_http_server server;
		enum cio_error err = cio_http_server_init(&server, &loop, &config);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Server initialization failed!");

		struct cio_http_location target;
		err = cio_http_location_init(&target, "/foo", NULL, alloc_dummy_handler);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Request target initialization failed!");

		err = cio_http_server_register_location(&server, &target);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Register request target failed!");

		const char *request = "GET /foo HTTP/1.1" CRLF "foo: bar" CRLF CRLF "GET /foo HTTP/1.1" CRLF "foo: bar" CRLF CRLF;

		split_request(request);

		err = cio_http_server_serve(&server);
		TEST_ASSERT_EQUAL_MESSAGE(CIO_SUCCESS, err, "Serving http failed!");

		TEST_ASSERT_EQUAL_MESSAGE(1, serve_error_fake.call_count, "Serve error callback was not called!");
		check_http_response(test.expected_response);

		setUp();
	}

	free_dummy_client(client_socket);
}